

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStreamWrapper::tryGetReadBuffer(BufferedInputStreamWrapper *this)

{
  InputStream *pIVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  undefined4 extraout_var;
  ArrayPtr<unsigned_char> AVar5;
  ArrayPtr<const_unsigned_char> AVar6;
  uchar *local_38;
  size_t local_30;
  size_t n;
  BufferedInputStreamWrapper *this_local;
  
  sVar3 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
  if (sVar3 == 0) {
    pIVar1 = this->inner;
    puVar4 = ArrayPtr<unsigned_char>::begin(&this->buffer);
    sVar3 = ArrayPtr<unsigned_char>::size(&this->buffer);
    iVar2 = (*pIVar1->_vptr_InputStream[2])(pIVar1,puVar4,1,sVar3);
    AVar5 = ArrayPtr<unsigned_char>::slice(&this->buffer,0,CONCAT44(extraout_var,iVar2));
    local_38 = AVar5.ptr;
    (this->bufferAvailable).ptr = local_38;
    local_30 = AVar5.size_;
    (this->bufferAvailable).size_ = local_30;
  }
  AVar6 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&this->bufferAvailable);
  return AVar6;
}

Assistant:

ArrayPtr<const byte> BufferedInputStreamWrapper::tryGetReadBuffer() {
  if (bufferAvailable.size() == 0) {
    size_t n = inner.tryRead(buffer.begin(), 1, buffer.size());
    bufferAvailable = buffer.slice(0, n);
  }

  return bufferAvailable;
}